

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void lj_gc_closeuv(global_State *g,GCupval *uv)

{
  undefined8 uVar1;
  global_State *in_RSI;
  long in_RDI;
  GCobj *o;
  
  uVar1 = *(undefined8 *)(ulong)(uint)(in_RSI->strbloom).cur[0];
  in_RSI->strmask = (int)uVar1;
  in_RSI->strnum = (int)((ulong)uVar1 >> 0x20);
  *(int *)(in_RSI->strbloom).cur = (int)in_RSI + 8;
  *(undefined1 *)((long)&in_RSI->strhash + 6) = 1;
  *(undefined4 *)&in_RSI->strhash = *(undefined4 *)(in_RDI + 0x60);
  *(int *)(in_RDI + 0x60) = (int)in_RSI;
  if (((ulong)in_RSI->strhash & 0x700000000) == 0) {
    if ((*(char *)(in_RDI + 0x59) == '\x01') || (*(char *)(in_RDI + 0x59) == '\x02')) {
      *(byte *)((long)&in_RSI->strhash + 4) = *(byte *)((long)&in_RSI->strhash + 4) | 4;
      if ((0xfffffff6 < in_RSI->strnum + 4) && ((*(byte *)((ulong)in_RSI->strmask + 4) & 3) != 0)) {
        lj_gc_barrierf(in_RSI,(GCobj *)in_RSI,(GCobj *)0x118f66);
      }
    }
    else {
      *(byte *)((long)&in_RSI->strhash + 4) =
           *(byte *)((long)&in_RSI->strhash + 4) & 0xf8 | *(byte *)(in_RDI + 0x58) & 3;
    }
  }
  return;
}

Assistant:

void lj_gc_closeuv(global_State *g, GCupval *uv)
{
  GCobj *o = obj2gco(uv);
  /* Copy stack slot to upvalue itself and point to the copy. */
  copyTV(mainthread(g), &uv->tv, uvval(uv));
  setmref(uv->v, &uv->tv);
  uv->closed = 1;
  setgcrefr(o->gch.nextgc, g->gc.root);
  setgcref(g->gc.root, o);
  if (isgray(o)) {  /* A closed upvalue is never gray, so fix this. */
    if (g->gc.state == GCSpropagate || g->gc.state == GCSatomic) {
      gray2black(o);  /* Make it black and preserve invariant. */
      if (tviswhite(&uv->tv))
	lj_gc_barrierf(g, o, gcV(&uv->tv));
    } else {
      makewhite(g, o);  /* Make it white, i.e. sweep the upvalue. */
      lj_assertG(g->gc.state != GCSfinalize && g->gc.state != GCSpause,
		 "bad GC state");
    }
  }
}